

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsproxywidget.cpp
# Opt level: O2

bool __thiscall QGraphicsProxyWidget::focusNextPrevChild(QGraphicsProxyWidget *this,bool next)

{
  QGraphicsProxyWidgetPrivate *this_00;
  bool bVar1;
  QWidget *pQVar2;
  
  this_00 = *(QGraphicsProxyWidgetPrivate **)(this + 0x18);
  bVar1 = QPointer::operator_cast_to_bool((QPointer *)&this_00->widget);
  if ((bVar1) &&
     ((this_00->super_QGraphicsWidgetPrivate).super_QGraphicsItemPrivate.scene !=
      (QGraphicsScene *)0x0)) {
    pQVar2 = QWidget::focusWidget((QWidget *)(this_00->widget).wp.value);
    pQVar2 = QGraphicsProxyWidgetPrivate::findFocusChild(this_00,pQVar2,next);
    if (pQVar2 != (QWidget *)0x0) {
      QWidget::setFocus(pQVar2,BacktabFocusReason - next);
      return true;
    }
  }
  bVar1 = QGraphicsWidget::focusNextPrevChild((QGraphicsWidget *)this,next);
  return bVar1;
}

Assistant:

bool QGraphicsProxyWidget::focusNextPrevChild(bool next)
{
    Q_D(QGraphicsProxyWidget);
    if (!d->widget || !d->scene)
        return QGraphicsWidget::focusNextPrevChild(next);

    Qt::FocusReason reason = next ? Qt::TabFocusReason : Qt::BacktabFocusReason;
    QWidget *lastFocusChild = d->widget->focusWidget();
    if (QWidget *newFocusChild = d->findFocusChild(lastFocusChild, next)) {
        newFocusChild->setFocus(reason);
        return true;
    }

    return QGraphicsWidget::focusNextPrevChild(next);
}